

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O1

void __thiscall EOClient::~EOClient(EOClient *this)

{
  ~EOClient(this);
  operator_delete(this,0x1d0);
  return;
}

Assistant:

EOClient::~EOClient()
{
	if (this->upload_fh)
	{
		std::fclose(this->upload_fh);
	}

	if (this->player)
	{
		delete this->player;
	}
}